

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgtdm(fitsfile *fptr,int colnum,int maxdim,int *naxis,long *naxes,int *status)

{
  int *in_R9;
  char tdimstr [71];
  char keyname [75];
  int tstatus;
  int *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  int *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  long *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  undefined4 local_4;
  
  if (*in_R9 < 1) {
    ffkeyn((char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
           in_stack_ffffffffffffff40);
    ffgkys(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
           in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    ffdtdm(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
           in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_R9);
    local_4 = *in_R9;
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffgtdm(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colnum,      /* I - number of the column to read             */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *naxis,      /* O - number of axes in the data array         */
           long naxes[],    /* O - length of each data axis                 */
           int *status)     /* IO - error status                            */
/*
  read and parse the TDIMnnn keyword to get the dimensionality of a column
*/
{
    int tstatus = 0;
    char keyname[FLEN_KEYWORD], tdimstr[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    ffkeyn("TDIM", colnum, keyname, status);      /* construct keyword name */

    ffgkys(fptr, keyname, tdimstr, NULL, &tstatus); /* try reading keyword */

    ffdtdm(fptr, tdimstr, colnum, maxdim,naxis, naxes, status); /* decode it */

    return(*status);
}